

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O1

Cdr * __thiscall eprosima::fastcdr::Cdr::serialize(Cdr *this,float float_t)

{
  char *pcVar1;
  bool bVar2;
  NotEnoughMemoryException *this_00;
  ulong uVar3;
  float *pfVar4;
  
  pcVar1 = (this->m_currentPosition).m_currentPosition;
  uVar3 = 0;
  if (this->m_lastDataSize < 4) {
    uVar3 = (ulong)(*(int *)&(this->m_alignPosition).m_currentPosition - (int)pcVar1 & 3);
  }
  if ((ulong)((long)(this->m_lastPosition).m_currentPosition - (long)pcVar1) < uVar3 + 4) {
    bVar2 = resize(this,uVar3 + 4);
    if (!bVar2) {
      this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
      exception::NotEnoughMemoryException::NotEnoughMemoryException
                (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
      __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
                  exception::NotEnoughMemoryException::~NotEnoughMemoryException);
    }
  }
  this->m_lastDataSize = 4;
  pfVar4 = (float *)((this->m_currentPosition).m_currentPosition + uVar3);
  (this->m_currentPosition).m_currentPosition = (char *)pfVar4;
  if (this->m_swapBytes == true) {
    (this->m_currentPosition).m_currentPosition = (char *)((long)pfVar4 + 1);
    *(char *)pfVar4 = (char)((uint)float_t >> 0x18);
    pcVar1 = (this->m_currentPosition).m_currentPosition;
    (this->m_currentPosition).m_currentPosition = pcVar1 + 1;
    *pcVar1 = (char)((uint)float_t >> 0x10);
    pcVar1 = (this->m_currentPosition).m_currentPosition;
    (this->m_currentPosition).m_currentPosition = pcVar1 + 1;
    *pcVar1 = (char)((uint)float_t >> 8);
    pcVar1 = (this->m_currentPosition).m_currentPosition;
    (this->m_currentPosition).m_currentPosition = pcVar1 + 1;
    *pcVar1 = SUB41(float_t,0);
  }
  else {
    *pfVar4 = float_t;
    (this->m_currentPosition).m_currentPosition = (char *)(pfVar4 + 1);
  }
  return this;
}

Assistant:

Cdr& Cdr::serialize(const float float_t)
{
    size_t align = alignment(sizeof(float_t));
    size_t sizeAligned = sizeof(float_t) + align;

    if(((m_lastPosition - m_currentPosition) >= sizeAligned) || resize(sizeAligned))
    {
        // Save last datasize.
        m_lastDataSize = sizeof(float_t);

        // Align.
        makeAlign(align);

        if(m_swapBytes)
        {
            const char *dst = reinterpret_cast<const char*>(&float_t);

            m_currentPosition++ << dst[3];
            m_currentPosition++ << dst[2];
            m_currentPosition++ << dst[1];
            m_currentPosition++ << dst[0];
        }
        else
        {
            m_currentPosition << float_t;
            m_currentPosition += sizeof(float_t);
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}